

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayMethods.cpp
# Opt level: O2

void __thiscall
slang::ast::builtins::ArrayUniqueMethod::ArrayUniqueMethod
          (ArrayUniqueMethod *this,KnownSystemName knownNameId,bool isIndexed)

{
  SystemSubroutine::SystemSubroutine(&this->super_SystemSubroutine,knownNameId,Function);
  (this->super_SystemSubroutine)._vptr_SystemSubroutine =
       (_func_int **)&PTR__SystemSubroutine_00b7b9c8;
  this->isIndexed = isIndexed;
  (this->super_SystemSubroutine).withClauseMode = Iterator;
  return;
}

Assistant:

ArrayUniqueMethod(KnownSystemName knownNameId, bool isIndexed) :
        SystemSubroutine(knownNameId, SubroutineKind::Function), isIndexed(isIndexed) {
        withClauseMode = WithClauseMode::Iterator;
    }